

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mersenne_twister.hpp
# Opt level: O3

void __thiscall
boost::random::
mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
::twist(mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
        *this)

{
  uint *puVar1;
  uint *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  
  lVar9 = 0;
  uVar11 = this->x[0];
  do {
    uVar3 = this->x[lVar9 + 1];
    uVar10 = 0x9908b0df;
    if ((uVar3 & 1) == 0) {
      uVar10 = 0;
    }
    this->x[lVar9] =
         uVar10 ^ this->x[lVar9 + 0x18d] ^ (uVar3 & 0x7ffffffe | uVar11 & 0x80000000) >> 1;
    lVar9 = lVar9 + 1;
    uVar11 = uVar3;
  } while (lVar9 != 0xde);
  lVar9 = 0x26b;
  uVar11 = this->x[0xde];
  do {
    uVar3 = *(uint *)((long)this + lVar9 * 4 + -0x630);
    uVar10 = 0x9908b0df;
    if ((uVar3 & 1) == 0) {
      uVar10 = 0;
    }
    *(uint *)((long)this + lVar9 * 4 + -0x634) =
         uVar10 ^ this->x[lVar9] ^ (uVar3 & 0x7ffffffe | uVar11 & 0x80000000) >> 1;
    lVar9 = lVar9 + 1;
    uVar11 = uVar3;
  } while (lVar9 != 0x270);
  lVar9 = 0xe4;
  uVar11 = this->x[0xe3];
  do {
    puVar1 = this->x + lVar9;
    uVar3 = *puVar1;
    uVar10 = puVar1[1];
    uVar4 = puVar1[2];
    uVar5 = puVar1[3];
    puVar2 = (uint *)((long)this + lVar9 * 4 + -0x390);
    uVar6 = puVar2[1];
    uVar7 = puVar2[2];
    uVar8 = puVar2[3];
    puVar1 = this->x + lVar9 + -1;
    *puVar1 = (int)(uVar3 << 0x1f) >> 0x1f & 0x9908b0dfU ^ *puVar2 ^
              (uVar3 & 0x7ffffffe | uVar11 & 0x80000000) >> 1;
    puVar1[1] = (int)(uVar10 << 0x1f) >> 0x1f & 0x9908b0dfU ^ uVar6 ^
                (uVar10 & 0x7ffffffe | uVar3 & 0x80000000) >> 1;
    puVar1[2] = (int)(uVar4 << 0x1f) >> 0x1f & 0x9908b0dfU ^ uVar7 ^
                (uVar4 & 0x7ffffffe | uVar10 & 0x80000000) >> 1;
    puVar1[3] = (int)(uVar5 << 0x1f) >> 0x1f & 0x9908b0dfU ^ uVar8 ^
                (uVar5 & 0x7ffffffe | uVar4 & 0x80000000) >> 1;
    lVar9 = lVar9 + 4;
    uVar11 = uVar5;
  } while (lVar9 != 0x270);
  uVar11 = 0x9908b0df;
  if ((this->x[0] & 1) == 0) {
    uVar11 = 0;
  }
  this->x[0x26f] =
       uVar11 ^ this->x[0x18c] ^ (this->x[0] & 0x7ffffffe | this->x[0x26f] & 0x80000000) >> 1;
  this->i = 0;
  return;
}

Assistant:

void
mersenne_twister_engine<UIntType,w,n,m,r,a,u,d,s,b,t,c,l,f>::twist()
{
    const UIntType upper_mask = (~static_cast<UIntType>(0)) << r;
    const UIntType lower_mask = ~upper_mask;

    const std::size_t unroll_factor = 6;
    const std::size_t unroll_extra1 = (n-m) % unroll_factor;
    const std::size_t unroll_extra2 = (m-1) % unroll_factor;

    // split loop to avoid costly modulo operations
    {  // extra scope for MSVC brokenness w.r.t. for scope
        for(std::size_t j = 0; j < n-m-unroll_extra1; j++) {
            UIntType y = (x[j] & upper_mask) | (x[j+1] & lower_mask);
            x[j] = x[j+m] ^ (y >> 1) ^ ((x[j+1]&1) * a);
        }
    }
    {
        for(std::size_t j = n-m-unroll_extra1; j < n-m; j++) {
            UIntType y = (x[j] & upper_mask) | (x[j+1] & lower_mask);
            x[j] = x[j+m] ^ (y >> 1) ^ ((x[j+1]&1) * a);
        }
    }
    {
        for(std::size_t j = n-m; j < n-1-unroll_extra2; j++) {
            UIntType y = (x[j] & upper_mask) | (x[j+1] & lower_mask);
            x[j] = x[j-(n-m)] ^ (y >> 1) ^ ((x[j+1]&1) * a);
        }
    }
    {
        for(std::size_t j = n-1-unroll_extra2; j < n-1; j++) {
            UIntType y = (x[j] & upper_mask) | (x[j+1] & lower_mask);
            x[j] = x[j-(n-m)] ^ (y >> 1) ^ ((x[j+1]&1) * a);
        }
    }
    // last iteration
    UIntType y = (x[n-1] & upper_mask) | (x[0] & lower_mask);
    x[n-1] = x[m-1] ^ (y >> 1) ^ ((x[0]&1) * a);
    i = 0;
}